

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void highbd_blend_a64_d16_mask_subw0_subh0_w4_sse4_1
               (uint16_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,
               __m128i *round_offset,int shift,__m128i *clip_low,__m128i *clip_high,
               __m128i *mask_max)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  undefined4 *in_stack_00000008;
  uint in_stack_00000010;
  int in_stack_00000018;
  __m128i mask0b;
  __m128i mask0a;
  __m128i mask0b8;
  __m128i mask0a8;
  int in_stack_000000e4;
  CONV_BUF_TYPE *in_stack_000000e8;
  int in_stack_000000f4;
  CONV_BUF_TYPE *in_stack_000000f8;
  int in_stack_00000104;
  uint16_t *in_stack_00000108;
  __m128i *in_stack_000005a0;
  __m128i *in_stack_000005a8;
  __m128i *in_stack_000005b0;
  int in_stack_000005b8;
  __m128i *in_stack_000005c0;
  __m128i *in_stack_000005c8;
  __m128i *in_stack_000005d0;
  
  do {
    uVar4 = CONCAT44(*in_stack_00000008,
                     *(undefined4 *)((long)in_stack_00000008 + (ulong)in_stack_00000010));
    uVar3 = CONCAT44(*(undefined4 *)((long)in_stack_00000008 + (ulong)(in_stack_00000010 * 2)),
                     *(undefined4 *)((long)in_stack_00000008 + (ulong)(in_stack_00000010 * 3)));
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar4;
    pmovzxbw(auVar2,uVar4);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    pmovzxbw(auVar1,uVar3);
    highbd_blend_a64_d16_mask_w4_sse4_1
              (in_stack_00000108,in_stack_00000104,in_stack_000000f8,in_stack_000000f4,
               in_stack_000000e8,in_stack_000000e4,in_stack_000005a0,in_stack_000005a8,
               in_stack_000005b0,in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
               in_stack_000005d0);
    in_stack_00000008 = (undefined4 *)((long)in_stack_00000008 + (ulong)(in_stack_00000010 << 2));
    in_stack_00000018 = in_stack_00000018 + -4;
  } while (in_stack_00000018 != 0);
  return;
}

Assistant:

static inline void highbd_blend_a64_d16_mask_subw0_subh0_w4_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h,
    const __m128i *round_offset, int shift, const __m128i *clip_low,
    const __m128i *clip_high, const __m128i *mask_max) {
  do {
    const __m128i mask0a8 =
        _mm_set_epi32(0, 0, *(int32_t *)mask, *(int32_t *)(mask + mask_stride));
    const __m128i mask0b8 =
        _mm_set_epi32(0, 0, *(int32_t *)(mask + 2 * mask_stride),
                      *(int32_t *)(mask + 3 * mask_stride));
    const __m128i mask0a = _mm_cvtepu8_epi16(mask0a8);
    const __m128i mask0b = _mm_cvtepu8_epi16(mask0b8);

    highbd_blend_a64_d16_mask_w4_sse4_1(
        dst, dst_stride, src0, src0_stride, src1, src1_stride, &mask0a, &mask0b,
        round_offset, shift, clip_low, clip_high, mask_max);

    dst += dst_stride * 4;
    src0 += src0_stride * 4;
    src1 += src1_stride * 4;
    mask += mask_stride * 4;
  } while (h -= 4);
}